

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O1

void __thiscall fasttext::QuantMatrix::load(QuantMatrix *this,istream *in)

{
  ProductQuantizer *pPVar1;
  pointer __p;
  ProductQuantizer *pPVar2;
  allocator_type local_41;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  std::istream::read((char *)in,(long)&this->qnorm_);
  std::istream::read((char *)in,(long)&(this->super_Matrix).m_);
  std::istream::read((char *)in,(long)&(this->super_Matrix).n_);
  std::istream::read((char *)in,(long)&this->codesize_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_40,(long)this->codesize_,&local_41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->codes_,&local_40);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::istream::read((char *)in,
                     (long)(this->codes_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  pPVar2 = (ProductQuantizer *)operator_new(0x50);
  pPVar2->nbits_ = 8;
  pPVar2->ksub_ = 0x100;
  pPVar2->max_points_per_cluster_ = 0x100;
  pPVar2->max_points_ = 0x10000;
  pPVar2->seed_ = 0x4d2;
  pPVar2->niter_ = 0x19;
  pPVar2->eps_ = 1e-07;
  *(undefined1 (*) [16])
   &(pPVar2->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl =
       ZEXT816(0) << 0x20;
  *(pointer *)((long)&(pPVar2->centroids_).super__Vector_base<float,_std::allocator<float>_> + 0x10)
       = (pointer)0x0;
  (pPVar2->rng)._M_x = 1;
  local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pPVar1 = (this->pq_)._M_t.
           super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           ._M_t.
           super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
           .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl;
  (this->pq_)._M_t.
  super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
  .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = pPVar2;
  if (pPVar1 != (ProductQuantizer *)0x0) {
    std::default_delete<fasttext::ProductQuantizer>::operator()
              ((default_delete<fasttext::ProductQuantizer> *)&this->pq_,pPVar1);
  }
  if ((ProductQuantizer *)
      local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (ProductQuantizer *)0x0) {
    std::default_delete<fasttext::ProductQuantizer>::operator()
              ((default_delete<fasttext::ProductQuantizer> *)&local_40,
               (ProductQuantizer *)
               local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  ProductQuantizer::load
            ((this->pq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,in);
  if (this->qnorm_ == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_40,(this->super_Matrix).m_,&local_41);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&this->norm_codes_,&local_40);
    if ((ProductQuantizer *)
        local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (ProductQuantizer *)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::istream::read((char *)in,
                       (long)(this->norm_codes_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    pPVar2 = (ProductQuantizer *)operator_new(0x50);
    pPVar2->nbits_ = 8;
    pPVar2->ksub_ = 0x100;
    pPVar2->max_points_per_cluster_ = 0x100;
    pPVar2->max_points_ = 0x10000;
    pPVar2->seed_ = 0x4d2;
    pPVar2->niter_ = 0x19;
    pPVar2->eps_ = 1e-07;
    *(undefined1 (*) [16])
     &(pPVar2->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl =
         ZEXT816(0) << 0x20;
    *(pointer *)
     ((long)&(pPVar2->centroids_).super__Vector_base<float,_std::allocator<float>_> + 0x10) =
         (pointer)0x0;
    (pPVar2->rng)._M_x = 1;
    local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pPVar1 = (this->npq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl;
    (this->npq_)._M_t.
    super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
    ._M_t.
    super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
    .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = pPVar2;
    if (pPVar1 != (ProductQuantizer *)0x0) {
      std::default_delete<fasttext::ProductQuantizer>::operator()
                ((default_delete<fasttext::ProductQuantizer> *)&this->npq_,pPVar1);
    }
    if ((ProductQuantizer *)
        local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (ProductQuantizer *)0x0) {
      std::default_delete<fasttext::ProductQuantizer>::operator()
                ((default_delete<fasttext::ProductQuantizer> *)&local_40,
                 (ProductQuantizer *)
                 local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    ProductQuantizer::load
              ((this->npq_)._M_t.
               super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
               .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,in);
  }
  return;
}

Assistant:

void QuantMatrix::load(std::istream& in) {
  in.read((char*)&qnorm_, sizeof(qnorm_));
  in.read((char*)&m_, sizeof(m_));
  in.read((char*)&n_, sizeof(n_));
  in.read((char*)&codesize_, sizeof(codesize_));
  codes_ = std::vector<uint8_t>(codesize_);
  in.read((char*)codes_.data(), codesize_ * sizeof(uint8_t));
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer());
  pq_->load(in);
  if (qnorm_) {
    norm_codes_ = std::vector<uint8_t>(m_);
    in.read((char*)norm_codes_.data(), m_ * sizeof(uint8_t));
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer());
    npq_->load(in);
  }
}